

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall
ASDCP::MXF::ISXDDataEssenceDescriptor::ISXDDataEssenceDescriptor
          (ISXDDataEssenceDescriptor *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  MDDEntry *pMVar3;
  
  GenericDataEssenceDescriptor::GenericDataEssenceDescriptor
            (&this->super_GenericDataEssenceDescriptor,d);
  (this->super_GenericDataEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor.
  super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__ISXDDataEssenceDescriptor_00218e10;
  (this->NamespaceURI).super_string._M_dataplus._M_p =
       (pointer)&(this->NamespaceURI).super_string.field_2;
  (this->NamespaceURI).super_string._M_string_length = 0;
  (this->NamespaceURI).super_string.field_2._M_local_buf[0] = '\0';
  (this->NamespaceURI).super_IArchive._vptr_IArchive = (_func_int **)&PTR__ISO8String_00215ca0;
  this_00 = (this->super_GenericDataEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor.
            super_InterchangeObject.m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar3 = Dictionary::Type(this_00,MDD_ISXDDataEssenceDescriptor);
    uVar1 = *(undefined8 *)pMVar3->ul;
    uVar2 = *(undefined8 *)(pMVar3->ul + 8);
    *(bool *)((long)&(this->super_GenericDataEssenceDescriptor).super_FileDescriptor.
                     super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.m_UL.
                     super_Identifier<16U> + 8) = true;
    *(undefined8 *)
     ((long)&(this->super_GenericDataEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor
             .super_InterchangeObject.super_KLVPacket.m_UL.super_Identifier<16U> + 9) = uVar1;
    *(undefined8 *)
     ((long)&(this->super_GenericDataEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor
             .super_InterchangeObject.super_KLVPacket.m_UL.super_Identifier<16U> + 0x11) = uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x1355,
                "ASDCP::MXF::ISXDDataEssenceDescriptor::ISXDDataEssenceDescriptor(const Dictionary *)"
               );
}

Assistant:

ISXDDataEssenceDescriptor::ISXDDataEssenceDescriptor(const Dictionary* d) : GenericDataEssenceDescriptor(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_ISXDDataEssenceDescriptor);
}